

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char.c
# Opt level: O2

token * dmrC_get_string_constant(dmr_C *C,token *token,expression *expr)

{
  position pVar1;
  uint *p;
  ident *piVar2;
  uint *puVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  position pVar7;
  ulong uVar8;
  int iVar9;
  undefined1 local_2068 [8];
  char buffer [8191];
  undefined1 local_44 [4];
  int local_40;
  uint v;
  dmr_C *local_38;
  
  piVar2 = (token->field_2).ident;
  pVar1 = (position)token->next;
  v = (uint)(((ulong)token->pos & 0x3f) == 0x10);
  do {
    pVar7 = (position)0x0;
    do {
      if (pVar7 != (position)0x0) {
        lVar5 = 0x30;
        if (v == 0) {
          lVar5 = 0x18;
        }
        local_40 = *(int *)((long)&C->target->size_t_ctype + lVar5);
        uVar8 = 0;
        iVar9 = 0;
        local_38 = C;
        while (iVar6 = (int)uVar8, (position)token != pVar7) {
          puVar3 = *(uint **)((long)token + 0x10);
          p = puVar3 + 1;
          puVar3 = (uint *)((long)puVar3 + (ulong)(*puVar3 & 0x7fffffff) + 3);
          uVar8 = (ulong)iVar6;
          unique0x1000020f = (position)token;
          while (p < puVar3) {
            uVar4 = *p;
            p = (uint *)parse_escape(local_38,(char *)p,(uint *)local_44,(char *)puVar3,local_40,
                                     *(position *)stack0xffffffffffffff98);
            if ((long)uVar8 < 0x1fff) {
              local_2068[uVar8] = local_44[0];
            }
            iVar9 = iVar9 + (uint)((char)uVar4 == '\\');
            uVar8 = uVar8 + 1;
          }
          token = *(token **)((long)stack0xffffffffffffff98 + 8);
        }
        if (0x1fff < iVar6) {
          dmrC_warning(local_38,token->pos,
                       "trying to concatenate %d-character string (%d bytes max)",uVar8 & 0xffffffff
                       ,0x1fff);
          iVar6 = 0x1fff;
        }
        uVar4 = *(uint *)&piVar2->next;
        if ((iVar9 != 0) || ((int)(uVar4 & 0x7fffffff) <= iVar6)) {
          if (((int)uVar4 < 0) || ((int)uVar4 <= iVar6)) {
            piVar2 = (ident *)dmrC_allocator_allocate(&local_38->string_allocator,(long)(iVar6 + 1))
            ;
            uVar4 = *(uint *)&piVar2->next;
          }
          *(uint *)&piVar2->next = uVar4 & 0x80000000 | iVar6 + 1U & 0x7fffffff;
          memcpy((void *)((long)&piVar2->next + 4),local_2068,(long)iVar6);
          *(undefined1 *)((long)&piVar2->next + (long)iVar6 + 4U) = 0;
        }
        (expr->field_5).field_4.symbol_name = piVar2;
        (expr->field_5).field_15.idx_from = v;
        return (token *)(position)token;
      }
      if ((*(uint *)pVar1 & 0x3f) == 0x10) {
        v = 1;
        break;
      }
      pVar7 = pVar1;
    } while ((*(uint *)pVar1 & 0x3f) != 0xf);
    pVar1 = *(position *)((long)pVar1 + 8);
  } while( true );
}

Assistant:

struct token *dmrC_get_string_constant(struct dmr_C *C, struct token *token, struct expression *expr)
{
	struct string *string = token->string;
	struct token *next = token->next, *done = NULL;
	int stringtype = dmrC_token_type(token);
	int is_wide = stringtype == TOKEN_WIDE_STRING;
	char buffer[MAX_STRING];
	int len = 0;
	int bits;
	int esc_count = 0;

	while (!done) {
		switch (dmrC_token_type(next)) {
		case TOKEN_WIDE_STRING:
			is_wide = 1;
		case TOKEN_STRING:
			next = next->next;
			break;
		default:
			done = next;
		}
	}
	bits = is_wide ? C->target->bits_in_wchar : C->target->bits_in_char;
	while (token != done) {
		unsigned v;
		const char *p = token->string->data;
		const char *end = p + token->string->length - 1;
		while (p < end) {
			if (*p == '\\')
				esc_count++;
			p = parse_escape(C, p, &v, end, bits, token->pos);
			if (len < MAX_STRING)
				buffer[len] = v;
			len++;
		}
		token = token->next;
	}
	if (len > MAX_STRING) {
		dmrC_warning(C, token->pos, "trying to concatenate %d-character string (%d bytes max)", len, MAX_STRING);
		len = MAX_STRING;
	}

	if (esc_count || len >= (int)string->length) {
		if (string->immutable || len >= string->length)	/* can't cannibalize */
			string = (struct string *)dmrC_allocator_allocate(&C->string_allocator, len+1);
		string->length = len+1;
		memcpy(string->data, buffer, len);
		string->data[len] = '\0';
	}
	expr->string = string;
	expr->wide = is_wide;
	return token;
}